

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::BeginGlobal
          (BinaryReaderIR *this,Index index,Type type,bool mutable_)

{
  char *__s;
  Offset OVar1;
  size_t sVar2;
  undefined1 auStack_68 [8];
  Location loc;
  tuple<wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_> local_40;
  unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_> field;
  
  loc.filename.size_._0_4_ = 0;
  loc.filename.size_._4_4_ = 0;
  loc.field_1.field_0.line = 0;
  auStack_68 = (undefined1  [8])0x0;
  loc.filename.data_._0_4_ = 0;
  loc.filename.data_._4_4_ = 0;
  __s = this->filename_;
  sVar2 = strlen(__s);
  loc.filename.data_._0_4_ = (undefined4)sVar2;
  loc.filename.data_._4_4_ = (undefined4)(sVar2 >> 0x20);
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc.filename.size_._0_4_ = (undefined4)OVar1;
  loc.filename.size_._4_4_ = (undefined4)(OVar1 >> 0x20);
  auStack_68 = (undefined1  [8])__s;
  MakeUnique<wabt::GlobalModuleField,wabt::Location>((wabt *)&local_40,(Location *)auStack_68);
  *(Type *)((long)local_40.
                  super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
                  .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 0x60) =
       type;
  *(bool *)((long)local_40.
                  super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
                  .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 100) =
       mutable_;
  field._M_t.
  super___uniq_ptr_impl<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>._M_t
  .super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>.
  super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>,_true,_true>
        )(__uniq_ptr_data<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>,_true,_true>
          )local_40.
           super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
           .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl;
  local_40.
  super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>.
  super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>)
       (_Head_base<0UL,_wabt::GlobalModuleField_*,_false>)0x0;
  Module::AppendField(this->module_,&field);
  if ((__uniq_ptr_impl<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>)
      field._M_t.
      super___uniq_ptr_impl<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>.
      _M_t.
      super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
      .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>)0x0)
  {
    (**(code **)(*(long *)field._M_t.
                          super___uniq_ptr_impl<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
                          .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 8)
    )();
  }
  field._M_t.
  super___uniq_ptr_impl<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>._M_t
  .super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>.
  super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>,_true,_true>
        )(__uniq_ptr_impl<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>)
         0x0;
  if (local_40.
      super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
      .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl !=
      (_Head_base<0UL,_wabt::GlobalModuleField_*,_false>)0x0) {
    (**(code **)(*(long *)local_40.
                          super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
                          .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 8)
    )();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::BeginGlobal(Index index, Type type, bool mutable_) {
  auto field = MakeUnique<GlobalModuleField>(GetLocation());
  Global& global = field->global;
  global.type = type;
  global.mutable_ = mutable_;
  module_->AppendField(std::move(field));
  return Result::Ok;
}